

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  void *this;
  reference piVar4;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> r;
  int i;
  int local_3c [2];
  int k;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  
  pq._28_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)&n,(less<int> *)((long)&k + 3));
  local_3c[1] = 10;
  std::istream::operator>>((istream *)&std::cin,local_3c);
  for (r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 10;
      r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    CP::priority_queue<int,_std::less<int>_>::push
              ((priority_queue<int,_std::less<int>_> *)&n,
               (int *)&r.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  CP::priority_queue<int,_std::less<int>_>::at_level
            ((vector<int,_std::allocator<int>_> *)&__range1,
             (priority_queue<int,_std::less<int>_> *)&n,(long)local_3c[0]);
  poVar2 = std::operator<<((ostream *)&std::cout,"size = ");
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)&__range1);
  this = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*piVar4);
    std::operator<<(poVar2," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)&n);
  return pq._28_4_;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false); cin.tie(NULL);

  CP::priority_queue<int> pq;

  int n,k;
  n = 10;
  cin >> k;
//  cin >> n >> k;
//  while(n--) {
//    int x;
//    cin >> x;
//    pq.push(x);
//  }
  for (int i = 0; i < 10; ++i) {
      pq.push(i);
  }

  std::vector<int> r = pq.at_level(k);
  cout << "size = " << r.size() << endl;
  for (auto &x : r) {
    cout << x << " ";
  }
  cout << endl;

}